

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple.cc
# Opt level: O3

void LogText::Log(string *line)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  long lVar3;
  _List_node_base *p_Var4;
  ostream *poVar5;
  _List_node_base *p_Var6;
  long in_FS_OFFSET;
  _List_node_base *local_38;
  _List_node_base local_28;
  
  lVar3 = *(long *)(in_FS_OFFSET + -8);
  if (lVar3 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"*** Not captured: \"",0x13);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(line->_M_dataplus)._M_p,line->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" ***",5);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
    std::ostream::put((char)poVar5);
    std::ostream::flush();
    return;
  }
  local_38 = (_List_node_base *)(line->_M_dataplus)._M_p;
  paVar1 = &line->field_2;
  if (local_38 == (_List_node_base *)paVar1) {
    local_28._M_next = (_List_node_base *)paVar1->_M_allocated_capacity;
    local_28._M_prev = *(_List_node_base **)((long)&line->field_2 + 8);
    local_38 = &local_28;
  }
  else {
    local_28._M_next = (_List_node_base *)paVar1->_M_allocated_capacity;
  }
  p_Var4 = (_List_node_base *)line->_M_string_length;
  (line->_M_dataplus)._M_p = (pointer)paVar1;
  line->_M_string_length = 0;
  (line->field_2)._M_local_buf[0] = '\0';
  p_Var6 = (_List_node_base *)operator_new(0x30);
  p_Var6[1]._M_next = p_Var6 + 2;
  if (local_38 == &local_28) {
    p_Var6[2]._M_next = local_28._M_next;
    p_Var6[2]._M_prev = local_28._M_prev;
  }
  else {
    p_Var6[1]._M_next = local_38;
    p_Var6[2]._M_next = local_28._M_next;
  }
  p_Var6[1]._M_prev = p_Var4;
  local_28._M_next = (_List_node_base *)((ulong)local_28._M_next & 0xffffffffffffff00);
  std::__detail::_List_node_base::_M_hook(p_Var6);
  plVar2 = (long *)(lVar3 + 0x18);
  *plVar2 = *plVar2 + 1;
  return;
}

Assistant:

static void Log(std::string line) {
    if (GetCurrent()) {
      GetCurrent()->LogLine(std::move(line));
    } else {
      std::cerr << "*** Not captured: \"" << line << "\" ***" << std::endl;
    }
  }